

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O0

void Int2_ManStop(Int2_Man_t *p)

{
  Int2_Man_t *p_local;
  
  if (p != (Int2_Man_t *)0x0) {
    Gia_ManStopP(&p->pGia);
    Vec_IntFree(p->vGloVars);
    Vec_IntFree(p->vVar2Glo);
    if (p != (Int2_Man_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Int2_ManStop( Int2_Man_t * p )
{
    if ( p == NULL )
        return;
    Gia_ManStopP( &p->pGia );
    Vec_IntFree( p->vGloVars );
    Vec_IntFree( p->vVar2Glo );
    ABC_FREE( p );
}